

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

void ordinary(parse *p,int ch)

{
  int iVar1;
  cat_t *pcVar2;
  char cVar3;
  ushort **ppuVar4;
  long opnd;
  char local_3b [3];
  char *local_38;
  char *pcStack_30;
  
  pcVar2 = p->g->categories;
  if ((((p->g->cflags & 2) == 0) ||
      (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)ch * 2 + 1) & 4) == 0)) ||
     (cVar3 = othercase(ch), cVar3 == ch)) {
    opnd = (long)ch;
    doemit(p,0x8000000,opnd);
    if (pcVar2[opnd] == '\0') {
      iVar1 = p->g->ncategories;
      p->g->ncategories = iVar1 + 1;
      pcVar2[opnd] = (cat_t)iVar1;
    }
  }
  else {
    local_38 = p->next;
    pcStack_30 = p->end;
    cVar3 = othercase(ch);
    if (cVar3 == ch) {
      __assert_fail("othercase(ch) != ch",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x3dd,"void bothcases()");
    }
    p->next = local_3b;
    p->end = local_3b + 2;
    local_3b[1] = ']';
    local_3b[2] = '\0';
    local_3b[0] = (char)ch;
    p_bracket(p);
    if (p->next != local_3b + 2) {
      __assert_fail("p->next == bracket+2",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x3e4,"void bothcases()");
    }
    p->next = local_38;
    p->end = pcStack_30;
  }
  return;
}

Assistant:

static void
ordinary(p, ch)
struct parse *p;
int ch;
{
	cat_t *cap = p->g->categories;

	if ((p->g->cflags&REG_ICASE) && isalpha(ch) && othercase(ch) != ch)
		bothcases(p, ch);
	else {
		EMIT(OCHAR, (sopno)ch);
		if (cap[ch] == 0)
			cap[ch] = (cat_t)(p->g->ncategories++);
	}
}